

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::MthdKelvinLineStipplePattern::~MthdKelvinLineStipplePattern
          (MthdKelvinLineStipplePattern *this)

{
  pointer pcVar1;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_00356770;
  pcVar1 = (this->super_SingleMthdTest).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SingleMthdTest).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0xffff00ff;
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
				if (rnd() & 1) {
					val |= 1 << (rnd() & 0x1f);
				}
			}
		}
		adjust_orig_bundle(&orig);
	}